

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5IndexMerge(Fts5Index *p,Fts5Structure **ppStruct,int nPg,int nMin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int iLvl;
  ulong uVar6;
  Fts5Structure *pStruct;
  int nRem;
  Fts5Structure *local_40;
  int local_34;
  
  local_40 = *ppStruct;
  iVar2 = 0;
  if ((0 < nPg) && (iVar2 = 0, p->rc == 0)) {
    iVar3 = 0;
    local_34 = nPg;
    do {
      iVar2 = iVar3;
      iLvl = 0;
      iVar3 = 0;
      if (0 < (long)local_40->nLevel) {
        piVar5 = &local_40->aLevel[0].nSeg;
        uVar4 = 0;
        iVar3 = 0;
        uVar6 = 0;
        do {
          iLvl = (int)uVar6;
          iVar1 = ((Fts5StructureLevel *)(piVar5 + -1))->nMerge;
          if (iVar1 != 0) {
            if (iVar3 < iVar1) {
              iLvl = (int)uVar4;
              iVar3 = iVar1;
            }
            break;
          }
          iVar1 = *piVar5;
          if (iVar3 < iVar1) {
            uVar6 = uVar4 & 0xffffffff;
          }
          iLvl = (int)uVar6;
          if (iVar3 < iVar1) {
            iVar3 = iVar1;
          }
          uVar4 = uVar4 + 1;
          piVar5 = piVar5 + 4;
        } while ((long)local_40->nLevel != uVar4);
      }
      if ((iVar3 < nMin) && (local_40->aLevel[iLvl].nMerge == 0)) break;
      fts5IndexMergeLevel(p,&local_40,iLvl,&local_34);
      if ((p->rc == 0) && (local_40->aLevel[iLvl].nMerge == 0)) {
        fts5StructurePromote(p,iLvl + 1,local_40);
      }
      if (local_34 < 1) {
        iVar2 = 1;
        break;
      }
      iVar2 = 1;
      iVar3 = 1;
    } while (p->rc == 0);
  }
  *ppStruct = local_40;
  return iVar2;
}

Assistant:

static int fts5IndexMerge(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Current structure of index */
  int nPg,                        /* Pages of work to do */
  int nMin                        /* Minimum number of segments to merge */
){
  int nRem = nPg;
  int bRet = 0;
  Fts5Structure *pStruct = *ppStruct;
  while( nRem>0 && p->rc==SQLITE_OK ){
    int iLvl;                   /* To iterate through levels */
    int iBestLvl = 0;           /* Level offering the most input segments */
    int nBest = 0;              /* Number of input segments on best level */

    /* Set iBestLvl to the level to read input segments from. */
    assert( pStruct->nLevel>0 );
    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
      if( pLvl->nMerge ){
        if( pLvl->nMerge>nBest ){
          iBestLvl = iLvl;
          nBest = pLvl->nMerge;
        }
        break;
      }
      if( pLvl->nSeg>nBest ){
        nBest = pLvl->nSeg;
        iBestLvl = iLvl;
      }
    }

    /* If nBest is still 0, then the index must be empty. */
#ifdef SQLITE_DEBUG
    for(iLvl=0; nBest==0 && iLvl<pStruct->nLevel; iLvl++){
      assert( pStruct->aLevel[iLvl].nSeg==0 );
    }
#endif

    if( nBest<nMin && pStruct->aLevel[iBestLvl].nMerge==0 ){
      break;
    }
    bRet = 1;
    fts5IndexMergeLevel(p, &pStruct, iBestLvl, &nRem);
    if( p->rc==SQLITE_OK && pStruct->aLevel[iBestLvl].nMerge==0 ){
      fts5StructurePromote(p, iBestLvl+1, pStruct);
    }
  }
  *ppStruct = pStruct;
  return bRet;
}